

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiInputSource IVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_7c;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  uVar9 = data_type & 0xfffffffe;
  bVar12 = uVar9 != 8;
  bVar1 = v_max <= v_min;
  bVar2 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar11 = flags & 1;
  IVar6 = GImGui->ActiveIdSource;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar5) || ((pIVar4->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar6 = pIVar4->ActiveIdSource;
      goto LAB_0014ef79;
    }
    pfVar7 = ImVec2::operator[](&(pIVar4->IO).MouseDelta,(ulong)uVar11);
    fVar15 = *pfVar7;
    if ((pIVar4->IO).KeyAlt != false) {
      fVar15 = fVar15 * 0.01;
    }
    if ((pIVar4->IO).KeyShift == true) {
      fVar15 = fVar15 * 10.0;
    }
  }
  else {
LAB_0014ef79:
    fVar15 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      iVar10 = 0;
      if (uVar9 == 8) {
        iVar10 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar7 = ImVec2::operator[](&local_38,(ulong)uVar11);
      fVar15 = *pfVar7;
      fVar14 = GetMinimumStepAtDecimalPrecision(iVar10);
      v_speed = (float)((uint)v_speed & -(uint)(fVar14 <= v_speed) |
                       ~-(uint)(fVar14 <= v_speed) & (uint)fVar14);
    }
  }
  fVar15 = fVar15 * v_speed;
  fVar14 = fVar15;
  if (uVar11 != 0) {
    fVar14 = -fVar15;
  }
  iVar10 = v_max - v_min;
  if (iVar10 == 0 || v_max < v_min) {
    bVar5 = false;
LAB_0014f07d:
    bVar3 = false;
  }
  else {
    if ((*v < v_max) || (bVar5 = true, fVar14 <= 0.0)) {
      bVar5 = fVar14 < 0.0 && *v <= v_min;
    }
    if ((bVar1 || bVar12) || bVar2) goto LAB_0014f07d;
    if ((fVar14 < 0.0) && (0.0 < pIVar4->DragCurrentAccum)) goto LAB_0014f0b2;
    if (fVar14 <= 0.0) goto LAB_0014f07d;
    bVar3 = pIVar4->DragCurrentAccum <= 0.0 && pIVar4->DragCurrentAccum != 0.0;
  }
  if (((pIVar4->ActiveIdIsJustActivated == false) && (!bVar5)) && (!bVar3)) {
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum + fVar14;
      pIVar4->DragCurrentAccumDirty = true;
    }
    else if ((pIVar4->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((bVar1 || bVar12) || bVar2) {
      iVar8 = *v + (int)pIVar4->DragCurrentAccum;
      local_7c = 0.0;
    }
    else {
      local_7c = powf((float)(*v - v_min) / (float)iVar10,1.0 / power);
      fVar13 = local_7c + pIVar4->DragCurrentAccum / (float)iVar10;
      fVar15 = 1.0;
      if (fVar13 <= 1.0) {
        fVar15 = fVar13;
      }
      fVar15 = powf((float)(~-(uint)(fVar13 < 0.0) & (uint)fVar15),power);
      iVar8 = (int)fVar15 * iVar10 + v_min;
    }
    iVar8 = RoundScalarWithFormatT<int,int>(format,data_type,iVar8);
    pIVar4->DragCurrentAccumDirty = false;
    if ((bVar1 || bVar12) || bVar2) {
      iVar10 = *v;
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(iVar8 - iVar10);
    }
    else {
      fVar15 = powf((float)(iVar8 - v_min) / (float)iVar10,1.0 / power);
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (fVar15 - local_7c);
      iVar10 = *v;
    }
    if ((v_min < v_max) && (iVar10 != iVar8)) {
      if ((iVar8 < v_min) || (((uVar9 != 8 && (iVar10 < iVar8)) && (fVar14 < 0.0)))) {
        iVar8 = v_min;
      }
      if ((v_max < iVar8) || (((uVar9 != 8 && (iVar8 < iVar10)) && (0.0 < fVar14)))) {
        iVar8 = v_max;
      }
    }
    if (iVar10 == iVar8) {
      return false;
    }
    *v = iVar8;
    return true;
  }
LAB_0014f0b2:
  pIVar4->DragCurrentAccum = 0.0;
  pIVar4->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}